

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall
ArrayToVectorState<true,_unsigned_int>::Float
          (ArrayToVectorState<true,_unsigned_int> *this,Context<true> *param_1,float f)

{
  uint local_c;
  
  local_c = (uint)(long)f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this->output_array,&local_c);
  return &this->super_BaseState<true>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& /* ctx */, float f)
  {
    output_array->push_back((T)f);
    return this;
  }